

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<int,duckdb::hugeint_t,duckdb::GenericUnaryWrapper,duckdb::DecimalScaleUpOperator>
               (int *ldata,hugeint_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong idx;
  int64_t *piVar4;
  ulong uVar5;
  idx_t idx_00;
  ulong idx_01;
  ulong uVar6;
  hugeint_t hVar7;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    piVar4 = &result_data->upper;
    for (idx_00 = 0; count != idx_00; idx_00 = idx_00 + 1) {
      hVar7 = DecimalScaleUpOperator::Operation<int,duckdb::hugeint_t>
                        (ldata[idx_00],result_mask,idx_00,dataptr);
      ((hugeint_t *)(piVar4 + -1))->lower = hVar7.lower;
      *piVar4 = hVar7.upper;
      piVar4 = piVar4 + 2;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    idx_01 = 0;
    for (uVar3 = 0; uVar3 != count + 0x3f >> 6; uVar3 = uVar3 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar6 = idx_01 + 0x40;
        if (count <= idx_01 + 0x40) {
          uVar6 = count;
        }
LAB_006e2756:
        piVar4 = &result_data[idx_01].upper;
        for (; idx = idx_01, idx_01 < uVar6; idx_01 = idx_01 + 1) {
          hVar7 = DecimalScaleUpOperator::Operation<int,duckdb::hugeint_t>
                            (ldata[idx_01],result_mask,idx_01,dataptr);
          ((hugeint_t *)(piVar4 + -1))->lower = hVar7.lower;
          *piVar4 = hVar7.upper;
          piVar4 = piVar4 + 2;
        }
      }
      else {
        uVar2 = puVar1[uVar3];
        uVar6 = idx_01 + 0x40;
        if (count <= idx_01 + 0x40) {
          uVar6 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_006e2756;
        idx = uVar6;
        if (uVar2 != 0) {
          piVar4 = &result_data[idx_01].upper;
          for (uVar5 = 0; idx = uVar5 + idx_01, idx < uVar6; uVar5 = uVar5 + 1) {
            if ((uVar2 >> (uVar5 & 0x3f) & 1) != 0) {
              hVar7 = DecimalScaleUpOperator::Operation<int,duckdb::hugeint_t>
                                (ldata[idx_01 + uVar5],result_mask,idx,dataptr);
              ((hugeint_t *)(piVar4 + -1))->lower = hVar7.lower;
              *piVar4 = hVar7.upper;
            }
            piVar4 = piVar4 + 2;
          }
        }
      }
      idx_01 = idx;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}